

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::GzipOutputStream::Init
          (GzipOutputStream *this,ZeroCopyOutputStream *sub_stream,Options *options)

{
  int iVar1;
  void *pvVar2;
  
  this->sub_stream_ = sub_stream;
  this->sub_data_ = (void *)0x0;
  this->sub_data_size_ = 0;
  iVar1 = options->buffer_size;
  this->input_buffer_length_ = (long)iVar1;
  pvVar2 = operator_new((long)iVar1);
  this->input_buffer_ = pvVar2;
  (this->zcontext_).next_in = (Bytef *)0x0;
  (this->zcontext_).avail_in = 0;
  (this->zcontext_).total_in = 0;
  (this->zcontext_).next_out = (Bytef *)0x0;
  (this->zcontext_).avail_out = 0;
  (this->zcontext_).total_out = 0;
  (this->zcontext_).msg = (char *)0x0;
  (this->zcontext_).zalloc = (alloc_func)0x0;
  (this->zcontext_).zfree = (free_func)0x0;
  (this->zcontext_).opaque = (voidpf)0x0;
  iVar1 = deflateInit2_(&this->zcontext_,options->compression_level,8,
                        (uint)(options->format != ZLIB) << 4 | 0xf,8,options->compression_strategy,
                        "1.2.11",0x70);
  this->zerror_ = iVar1;
  return;
}

Assistant:

void GzipOutputStream::Init(ZeroCopyOutputStream* sub_stream,
                            const Options& options) {
  sub_stream_ = sub_stream;
  sub_data_ = NULL;
  sub_data_size_ = 0;

  input_buffer_length_ = options.buffer_size;
  input_buffer_ = operator new(input_buffer_length_);
  ABSL_CHECK(input_buffer_ != NULL);

  zcontext_.zalloc = Z_NULL;
  zcontext_.zfree = Z_NULL;
  zcontext_.opaque = Z_NULL;
  zcontext_.next_out = NULL;
  zcontext_.avail_out = 0;
  zcontext_.total_out = 0;
  zcontext_.next_in = NULL;
  zcontext_.avail_in = 0;
  zcontext_.total_in = 0;
  zcontext_.msg = NULL;
  // default to GZIP format
  int windowBitsFormat = 16;
  if (options.format == ZLIB) {
    windowBitsFormat = 0;
  }
  zerror_ =
      deflateInit2(&zcontext_, options.compression_level, Z_DEFLATED,
                   /* windowBits */ 15 | windowBitsFormat,
                   /* memLevel (default) */ 8, options.compression_strategy);
}